

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

void __thiscall soul::CodeLocation::CodeLocation(CodeLocation *this,Ptr *code)

{
  SourceCodeText *pSVar1;
  
  (this->sourceCode).object = code->object;
  code->object = (SourceCodeText *)0x0;
  pSVar1 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
  (this->location).data = (pSVar1->utf8).data;
  return;
}

Assistant:

CodeLocation::CodeLocation (SourceCodeText::Ptr code)  : sourceCode (std::move (code)), location (sourceCode->utf8) {}